

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O3

int scan_docs(fdb_kvs_handle *db,dump_option *opt,char *kvs_name)

{
  char *__string;
  fdb_status fVar1;
  size_t keylen;
  fdb_iterator *fit;
  fdb_doc *local_38;
  fdb_iterator *local_30;
  
  local_38 = (fdb_doc *)0x0;
  __string = opt->one_key;
  if (__string == (char *)0x0) {
    if (opt->scan_mode == SCAN_BY_SEQ) {
      fVar1 = fdb_iterator_sequence_init(db,&local_30,0,0xffffffffffffffff,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return -2;
      }
      do {
        fVar1 = fdb_iterator_get(local_30,&local_38);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          print_doc(db,kvs_name,local_38->offset,opt);
          fdb_doc_free(local_38);
          local_38 = (fdb_doc *)0x0;
        }
        fVar1 = fdb_iterator_next(local_30);
      } while (fVar1 == FDB_RESULT_SUCCESS);
    }
    else {
      if (opt->scan_mode != SCAN_BY_KEY) {
        return 0;
      }
      fVar1 = fdb_iterator_init(db,&local_30,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return -2;
      }
      do {
        fVar1 = fdb_iterator_get(local_30,&local_38);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          print_doc(db,kvs_name,local_38->offset,opt);
          fdb_doc_free(local_38);
          local_38 = (fdb_doc *)0x0;
        }
        fVar1 = fdb_iterator_next(local_30);
      } while (fVar1 == FDB_RESULT_SUCCESS);
    }
    fdb_iterator_close(local_30);
  }
  else {
    keylen = strnlen(__string,0xff80);
    fdb_doc_create(&local_38,__string,keylen,(void *)0x0,0,(void *)0x0,0);
    fVar1 = fdb_get(db,local_38);
    if ((fVar1 != FDB_RESULT_SUCCESS) &&
       (fVar1 = fdb_get_metaonly(db,local_38), fVar1 != FDB_RESULT_SUCCESS)) {
      return -1;
    }
    print_doc(db,kvs_name,local_38->offset,opt);
    fdb_doc_free(local_38);
  }
  return 0;
}

Assistant:

int scan_docs(fdb_kvs_handle *db, struct dump_option *opt, char *kvs_name)
{
    uint64_t offset;
    fdb_iterator *fit;
    fdb_status fs;
    fdb_doc *fdoc = NULL;

    if (opt->one_key) {
        fdb_doc_create(&fdoc, opt->one_key,
                       strnlen(opt->one_key,FDB_MAX_KEYLEN), NULL, 0, NULL, 0);
       fs = fdb_get(db, fdoc);
       if (fs == FDB_RESULT_SUCCESS) {
           offset = fdoc->offset;
           print_doc(db, kvs_name, offset, opt);
       } else { // MB-22046: Also need to be able to print deleted doc
           fs = fdb_get_metaonly(db, fdoc);
           if (fs == FDB_RESULT_SUCCESS) {
               offset = fdoc->offset;
               print_doc(db, kvs_name, offset, opt);
           } else {
               return -1;
           }
       }
       fdb_doc_free(fdoc);
       fdoc = NULL;
    } else if (opt->scan_mode == SCAN_BY_KEY) {
        fs = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
        if (fs != FDB_RESULT_SUCCESS) {
            return -2;
        }
        do {
            if (fdb_iterator_get(fit, &fdoc) == FDB_RESULT_SUCCESS) {
                offset = fdoc->offset;
                print_doc(db, kvs_name, offset, opt);
                fdb_doc_free(fdoc);
                fdoc = NULL;
            }
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        fdb_iterator_close(fit);
    } else if (opt->scan_mode == SCAN_BY_SEQ) {
        fs = fdb_iterator_sequence_init(db, &fit, 0, -1, 0x0);
        if (fs != FDB_RESULT_SUCCESS) {
            return -2;
        }
        do {
            if (fdb_iterator_get(fit, &fdoc) == FDB_RESULT_SUCCESS) {
                offset = fdoc->offset;
                print_doc(db, kvs_name, offset, opt);
                fdb_doc_free(fdoc);
                fdoc = NULL;
            }
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        fdb_iterator_close(fit);
    }

    return 0;
}